

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O2

void Abc_SclLibFree(SC_Lib *p)

{
  undefined8 *puVar1;
  undefined8 *__ptr;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  int i;
  int iVar2;
  int i_00;
  int i_01;
  int i_1;
  int i_02;
  
  for (iVar2 = 0; iVar2 < (p->vWireLoads).nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(&p->vWireLoads,iVar2);
    Vec_IntErase((Vec_Int_t *)(puVar1 + 2));
    Vec_FltErase((Vec_Flt_t *)(puVar1 + 4));
    free((void *)*puVar1);
    free(puVar1);
  }
  Vec_PtrErase(&p->vWireLoads);
  for (iVar2 = 0; iVar2 < (p->vWireLoadSels).nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(&p->vWireLoadSels,iVar2);
    Vec_FltErase((Vec_Flt_t *)(puVar1 + 1));
    Vec_FltErase((Vec_Flt_t *)(puVar1 + 3));
    Vec_PtrFreeData((Vec_Ptr_t *)(puVar1 + 5));
    free((void *)*puVar1);
    free(puVar1);
  }
  Vec_PtrErase(&p->vWireLoadSels);
  for (iVar2 = 0; iVar2 < (p->vTempls).nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(&p->vTempls,iVar2);
    Vec_PtrFreeData((Vec_Ptr_t *)(puVar1 + 1));
    Vec_VecErase((Vec_Vec_t *)(puVar1 + 3));
    free((void *)*puVar1);
    free(puVar1);
  }
  Vec_PtrErase(&p->vTempls);
  for (iVar2 = 0; iVar2 < (p->vCells).nSize; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(&p->vCells,iVar2);
    for (i_01 = 0; i_01 < *(int *)((long)puVar1 + 0x34); i_01 = i_01 + 1) {
      __ptr = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar1 + 6),i_01);
      for (i_00 = 0; i_00 < *(int *)((long)__ptr + 0x44); i_00 = i_00 + 1) {
        __ptr_00 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(__ptr + 8),i_00);
        for (i_02 = 0; i_02 < *(int *)((long)__ptr_00 + 0xc); i_02 = i_02 + 1) {
          __ptr_01 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(__ptr_00 + 1),i_02);
          Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 3));
          Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x19));
          Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x2f));
          Abc_SclSurfaceFree((SC_Surface *)(__ptr_01 + 0x45));
          if ((void *)*__ptr_01 != (void *)0x0) {
            free((void *)*__ptr_01);
            *__ptr_01 = 0;
          }
          free((void *)__ptr_01[2]);
          free(__ptr_01);
        }
        Vec_PtrErase((Vec_Ptr_t *)(__ptr_00 + 1));
        free((void *)*__ptr_00);
        free(__ptr_00);
      }
      Vec_PtrErase((Vec_Ptr_t *)(__ptr + 8));
      if ((void *)__ptr[7] != (void *)0x0) {
        free((void *)__ptr[7]);
        __ptr[7] = 0;
      }
      __ptr[6] = 0;
      if ((void *)__ptr[5] != (void *)0x0) {
        free((void *)__ptr[5]);
        __ptr[5] = 0;
      }
      free((void *)*__ptr);
      free(__ptr);
    }
    Vec_PtrErase((Vec_Ptr_t *)(puVar1 + 6));
    free((void *)*puVar1);
    free(puVar1);
  }
  Vec_PtrErase(&p->vCells);
  Vec_PtrErase(&p->vCellClasses);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pFileName != (char *)0x0) {
    free(p->pFileName);
    p->pFileName = (char *)0x0;
  }
  if (p->default_wire_load != (char *)0x0) {
    free(p->default_wire_load);
    p->default_wire_load = (char *)0x0;
  }
  if (p->default_wire_load_sel != (char *)0x0) {
    free(p->default_wire_load_sel);
    p->default_wire_load_sel = (char *)0x0;
  }
  free(p->pBins);
  free(p);
  return;
}

Assistant:

static inline void Abc_SclLibFree( SC_Lib * p )
{
    SC_WireLoad * pWL;
    SC_WireLoadSel * pWLS;
    SC_TableTempl * pTempl;
    SC_Cell * pCell;
    int i;
    SC_LibForEachWireLoad( p, pWL, i )
        Abc_SclWireLoadFree( pWL );
    Vec_PtrErase( &p->vWireLoads );
    SC_LibForEachWireLoadSel( p, pWLS, i )
        Abc_SclWireLoadSelFree( pWLS );
    Vec_PtrErase( &p->vWireLoadSels );
    SC_LibForEachTempl( p, pTempl, i )
        Abc_SclTableTemplFree( pTempl );
    Vec_PtrErase( &p->vTempls );
    SC_LibForEachCell( p, pCell, i )
        Abc_SclCellFree( pCell );
    Vec_PtrErase( &p->vCells );
    Vec_PtrErase( &p->vCellClasses );
    ABC_FREE( p->pName );
    ABC_FREE( p->pFileName );
    ABC_FREE( p->default_wire_load );
    ABC_FREE( p->default_wire_load_sel );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}